

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O1

bool __thiscall
qpdf::Stream::pipeStreamData
          (Stream *this,Pipeline *pipeline,bool *filterp,int encode_flags,
          qpdf_stream_decode_level_e decode_level,bool suppress_warnings,bool will_retry)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  Buffer *this_00;
  element_type *peVar3;
  element_type *peVar4;
  long offset;
  QPDF *qpdf;
  QPDFObjGen og;
  Pipeline *pPVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Alloc_hider _Var7;
  char cVar8;
  int iVar9;
  Members *pMVar10;
  undefined4 extraout_var;
  Pl_Flate *this_01;
  uchar *puVar11;
  size_t sVar12;
  qpdf_offset_t value;
  longlong __val;
  runtime_error *this_02;
  long *plVar13;
  logic_error *this_03;
  size_type *psVar14;
  pointer psVar15;
  pointer psVar16;
  bool bVar17;
  bool local_27b;
  bool lossy_compression;
  bool specialized_compression;
  Pipeline *pipeline_local;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_270;
  Stream *local_268;
  bool *local_260;
  shared_ptr<Pipeline> new_pipeline;
  ContentNormalizer *local_240;
  Pl_Count count;
  string local_1f0;
  Members *local_1d0;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
  filters;
  QPDFObjectHandle local_168;
  vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> to_delete;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_b8;
  QPDFObjGen local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pipeline_local = pipeline;
  local_268 = this;
  pMVar10 = stream(this);
  filters.
  super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filters.
  super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  filters.
  super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  specialized_compression = false;
  lossy_compression = false;
  bVar17 = decode_level != qpdf_dl_none || encode_flags != 0;
  if (filterp != (bool *)0x0) {
    *filterp = bVar17;
  }
  local_260 = filterp;
  if (decode_level != qpdf_dl_none || encode_flags != 0) {
    local_27b = filterable(local_268,&filters,&specialized_compression,&lossy_compression);
    if (local_260 != (bool *)0x0) {
      *local_260 = local_27b;
      local_27b = bVar17;
    }
    bVar17 = local_27b;
    if ((int)decode_level < 3) {
      bVar17 = false;
      if (lossy_compression == false) {
        bVar17 = local_27b;
      }
      if (lossy_compression == true && local_260 != (bool *)0x0) {
        *local_260 = false;
        bVar17 = local_27b;
      }
    }
    local_27b = bVar17;
    bVar17 = local_27b;
    if ((int)decode_level < 2) {
      bVar17 = false;
      if (specialized_compression == false) {
        bVar17 = local_27b;
      }
      if (specialized_compression == true && local_260 != (bool *)0x0) {
        *local_260 = false;
        bVar17 = local_27b;
      }
    }
  }
  local_27b = bVar17;
  if (pipeline_local == (Pipeline *)0x0) {
    if (local_260 != (bool *)0x0) {
      local_27b = *local_260;
    }
  }
  else {
    to_delete.
    super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    to_delete.
    super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    to_delete.
    super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cVar8 = local_27b;
    if (local_260 != (bool *)0x0) {
      cVar8 = *local_260;
    }
    if (cVar8 == '\0') {
      local_270 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_240 = (ContentNormalizer *)0x0;
    }
    else {
      if ((encode_flags & 1U) != 0) {
        local_1c8._M_dataplus._M_p._0_4_ = 1;
        count.super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<Pl_Flate,std::allocator<Pl_Flate>,char_const(&)[16],Pipeline*&,Pl_Flate::action_e>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&count.super_Pipeline.identifier,
                   (Pl_Flate **)&count,(allocator<Pl_Flate> *)&local_1f0,
                   (char (*) [16])"compress stream",&pipeline_local,(action_e *)&local_1c8);
        _Var7 = count.super_Pipeline.identifier._M_dataplus;
        new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)count.super_Pipeline._vptr_Pipeline;
        _Var6 = new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        count.super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
        count.super_Pipeline.identifier._M_dataplus._M_p = (pointer)0x0;
        new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var7._M_p;
        if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
        }
        if (count.super_Pipeline.identifier._M_dataplus._M_p != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     count.super_Pipeline.identifier._M_dataplus._M_p);
        }
        local_270 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::
        push_back(&to_delete,&new_pipeline);
        pipeline_local =
             new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      if ((encode_flags & 2U) == 0) {
        local_270 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_240 = (ContentNormalizer *)0x0;
      }
      else {
        count.super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<ContentNormalizer,std::allocator<ContentNormalizer>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&count.super_Pipeline.identifier,
                   (ContentNormalizer **)&count,(allocator<ContentNormalizer> *)&local_1c8);
        local_270 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    count.super_Pipeline.identifier._M_dataplus;
        local_240 = (ContentNormalizer *)count.super_Pipeline._vptr_Pipeline;
        count.super_Pipeline.identifier._M_dataplus._M_p = (pointer)0x0;
        local_1c8._M_dataplus._M_p = (pointer)count.super_Pipeline._vptr_Pipeline;
        count.super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<Pl_QPDFTokenizer,std::allocator<Pl_QPDFTokenizer>,char_const(&)[11],ContentNormalizer*,Pipeline*&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&count.super_Pipeline.identifier,
                   (Pl_QPDFTokenizer **)&count,(allocator<Pl_QPDFTokenizer> *)&local_1f0,
                   (char (*) [11])"normalizer",(ContentNormalizer **)&local_1c8,&pipeline_local);
        _Var7 = count.super_Pipeline.identifier._M_dataplus;
        new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)count.super_Pipeline._vptr_Pipeline;
        _Var6 = new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        count.super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
        count.super_Pipeline.identifier._M_dataplus._M_p = (pointer)0x0;
        new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var7._M_p;
        if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
        }
        if (count.super_Pipeline.identifier._M_dataplus._M_p != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     count.super_Pipeline.identifier._M_dataplus._M_p);
        }
        std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::
        push_back(&to_delete,&new_pipeline);
        pipeline_local =
             new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      psVar15 = (pMVar10->token_filters).
                super__Vector_base<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_1d0 = pMVar10;
      if (psVar15 !=
          (pMVar10->token_filters).
          super__Vector_base<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          local_1c8._M_dataplus._M_p =
               (pointer)psVar15[-1].
                        super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
          count.super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<Pl_QPDFTokenizer,std::allocator<Pl_QPDFTokenizer>,char_const(&)[13],QPDFObjectHandle::TokenFilter*,Pipeline*&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&count.super_Pipeline.identifier,
                     (Pl_QPDFTokenizer **)&count,(allocator<Pl_QPDFTokenizer> *)&local_1f0,
                     (char (*) [13])"token filter",(TokenFilter **)&local_1c8,&pipeline_local);
          _Var7 = count.super_Pipeline.identifier._M_dataplus;
          new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)count.super_Pipeline._vptr_Pipeline;
          _Var6 = new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          count.super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
          count.super_Pipeline.identifier._M_dataplus._M_p = (pointer)0x0;
          new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var7._M_p;
          if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
          }
          if (count.super_Pipeline.identifier._M_dataplus._M_p != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       count.super_Pipeline.identifier._M_dataplus._M_p);
          }
          std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::
          push_back(&to_delete,&new_pipeline);
          psVar15 = psVar15 + -1;
          pipeline_local =
               new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        } while (psVar15 !=
                 (local_1d0->token_filters).
                 super__Vector_base<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      }
      pMVar10 = local_1d0;
      if (filters.
          super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          filters.
          super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        psVar16 = filters.
                  super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        do {
          peVar2 = psVar16[-1].super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar9 = (*peVar2->_vptr_QPDFStreamFilter[3])(peVar2,pipeline_local);
          if ((Pipeline *)CONCAT44(extraout_var,iVar9) != (Pipeline *)0x0) {
            pipeline_local = (Pipeline *)CONCAT44(extraout_var,iVar9);
          }
          if (pipeline_local == (Pipeline *)0x0) {
            this_01 = (Pl_Flate *)0x0;
          }
          else {
            this_01 = (Pl_Flate *)
                      __dynamic_cast(pipeline_local,&Pipeline::typeinfo,&Pl_Flate::typeinfo,0);
          }
          if (this_01 != (Pl_Flate *)0x0) {
            local_138._8_8_ = 0;
            local_138._M_unused._M_object = local_268;
            pcStack_120 = std::
                          _Function_handler<void_(const_char_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_Stream.cc:483:40)>
                          ::_M_invoke;
            local_128 = std::
                        _Function_handler<void_(const_char_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_Stream.cc:483:40)>
                        ::_M_manager;
            Pl_Flate::setWarnCallback(this_01,(function<void_(const_char_*,_int)> *)&local_138);
            if (local_128 != (code *)0x0) {
              (*local_128)(&local_138,&local_138,__destroy_functor);
            }
          }
          psVar16 = psVar16 + -1;
          pMVar10 = local_1d0;
        } while (psVar16 !=
                 filters.
                 super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    pPVar5 = pipeline_local;
    this_00 = (pMVar10->stream_data).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00 == (Buffer *)0x0) {
      if ((pMVar10->stream_provider).
          super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        peVar4 = (local_268->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        offset = peVar4->parsed_offset;
        if (offset == 0) {
          this_03 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_03,"pipeStreamData called for stream with no data");
          __cxa_throw(this_03,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        qpdf = peVar4->qpdf;
        og = peVar4->og;
        local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (pMVar10->stream_dict).super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        sVar12 = pMVar10->length;
        local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (pMVar10->stream_dict).super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_168.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_168.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_168.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_168.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_168.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        bVar17 = isRootMetadata(local_268);
        cVar8 = QPDF::Pipe::pipeStreamData
                          (qpdf,og,offset,sVar12,&local_168,bVar17,pipeline_local,suppress_warnings,
                           will_retry);
        if (local_168.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_168.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        bVar17 = false;
        if ((bool)cVar8) {
          bVar17 = local_27b;
        }
        if (local_260 != (bool *)0x0 && !(bool)cVar8) {
          *local_260 = false;
          cVar8 = '\0';
          bVar17 = local_27b;
        }
      }
      else {
        Pl_Count::Pl_Count(&count,"stream provider count",pipeline_local);
        bVar17 = QPDFObjectHandle::StreamDataProvider::supportsRetry
                           ((pMVar10->stream_provider).
                            super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
        peVar3 = (pMVar10->stream_provider).
                 super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if (bVar17) {
          local_1c8._M_dataplus._M_p =
               *(pointer *)
                &((local_268->super_BaseHandle).obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og;
          iVar9 = (*peVar3->_vptr_StreamDataProvider[3])
                            (peVar3,&local_1c8,&count,suppress_warnings,(ulong)will_retry);
          cVar8 = (char)iVar9;
          bVar17 = false;
          if (cVar8 != '\0') {
            bVar17 = local_27b;
          }
          if (local_260 != (bool *)0x0 && cVar8 == '\0') {
            *local_260 = false;
            cVar8 = '\0';
            bVar17 = local_27b;
          }
        }
        else {
          local_1c8._M_dataplus._M_p =
               *(pointer *)
                &((local_268->super_BaseHandle).obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og;
          (*peVar3->_vptr_StreamDataProvider[2])(peVar3,&local_1c8,&count);
          cVar8 = '\x01';
          bVar17 = local_27b;
        }
        local_27b = bVar17;
        value = Pl_Count::getCount(&count);
        if (cVar8 == '\0') {
          bVar17 = false;
        }
        else {
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"/Length","");
          bVar17 = QPDFObjectHandle::hasKey(&pMVar10->stream_dict,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar17 == false) {
          if (cVar8 != '\0') {
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"/Length","");
            QPDFObjectHandle::newInteger((QPDFObjectHandle *)&local_1a8,value);
            QPDFObjectHandle::replaceKey
                      (&pMVar10->stream_dict,&local_1f0,(QPDFObjectHandle *)&local_1a8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length)
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        else {
          paVar1 = &local_1f0.field_2;
          local_1f0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"/Length","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_1a8,(string *)&pMVar10->stream_dict);
          __val = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)&local_1a8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if (value != __val) {
            this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_98 = ((local_268->super_BaseHandle).obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og;
            QPDFObjGen::unparse_abi_cxx11_(&local_90,&local_98,' ');
            std::operator+(&local_70,"stream data provider for ",&local_90);
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_70);
            local_f8._M_dataplus._M_p = (pointer)*plVar13;
            psVar14 = (size_type *)(plVar13 + 2);
            if ((size_type *)local_f8._M_dataplus._M_p == psVar14) {
              local_f8.field_2._M_allocated_capacity = *psVar14;
              local_f8.field_2._8_8_ = plVar13[3];
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            }
            else {
              local_f8.field_2._M_allocated_capacity = *psVar14;
            }
            local_f8._M_string_length = plVar13[1];
            *plVar13 = (long)psVar14;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            std::__cxx11::to_string(&local_b8,value);
            std::operator+(&local_50,&local_f8,&local_b8);
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_118._M_dataplus._M_p = (pointer)*plVar13;
            psVar14 = (size_type *)(plVar13 + 2);
            if ((size_type *)local_118._M_dataplus._M_p == psVar14) {
              local_118.field_2._M_allocated_capacity = *psVar14;
              local_118.field_2._8_8_ = plVar13[3];
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            }
            else {
              local_118.field_2._M_allocated_capacity = *psVar14;
            }
            local_118._M_string_length = plVar13[1];
            *plVar13 = (long)psVar14;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            std::__cxx11::to_string(&local_d8,__val);
            std::operator+(&local_1a8,&local_118,&local_d8);
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_1a8);
            local_1f0._M_dataplus._M_p = (pointer)*plVar13;
            psVar14 = (size_type *)(plVar13 + 2);
            if ((size_type *)local_1f0._M_dataplus._M_p == psVar14) {
              local_1f0.field_2._M_allocated_capacity = *psVar14;
              local_1f0.field_2._8_8_ = plVar13[3];
              local_1f0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *psVar14;
            }
            local_1f0._M_string_length = plVar13[1];
            *plVar13 = (long)psVar14;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            std::runtime_error::runtime_error(this_02,(string *)&local_1f0);
            __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        Pl_Count::~Pl_Count(&count);
        bVar17 = local_27b;
      }
    }
    else {
      puVar11 = Buffer::getBuffer(this_00);
      sVar12 = Buffer::getSize((pMVar10->stream_data).
                               super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      (*pPVar5->_vptr_Pipeline[2])(pPVar5,puVar11,sVar12);
      cVar8 = '\x01';
      (*pipeline_local->_vptr_Pipeline[3])();
      bVar17 = local_27b;
    }
    local_27b = bVar17;
    if (local_260 != (bool *)0x0) {
      local_27b = *local_260;
    }
    if ((local_240 != (ContentNormalizer *)0x0 && (local_27b == true && !suppress_warnings)) &&
       (bVar17 = ContentNormalizer::anyBadTokens(local_240), bVar17)) {
      psVar14 = &count.super_Pipeline.identifier._M_string_length;
      count.super_Pipeline._vptr_Pipeline = (_func_int **)psVar14;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&count,"content normalization encountered bad tokens","");
      warn(local_268,(string *)&count);
      if (count.super_Pipeline._vptr_Pipeline != (_func_int **)psVar14) {
        operator_delete(count.super_Pipeline._vptr_Pipeline,
                        count.super_Pipeline.identifier._M_string_length + 1);
      }
      bVar17 = ContentNormalizer::lastTokenWasBad(local_240);
      if (bVar17) {
        count.super_Pipeline._vptr_Pipeline = (_func_int **)psVar14;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&count,
                   "normalized content ended with a bad token; you may be able to resolve this by coalescing content streams in combination with normalizing content. From the command line, specify --coalesce-contents"
                   ,"");
        warn(local_268,(string *)&count);
        if (count.super_Pipeline._vptr_Pipeline != (_func_int **)psVar14) {
          operator_delete(count.super_Pipeline._vptr_Pipeline,
                          count.super_Pipeline.identifier._M_string_length + 1);
        }
      }
      count.super_Pipeline._vptr_Pipeline = (_func_int **)psVar14;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&count,
                 "Resulting stream data may be corrupted but is may still useful for manual inspection. For more information on this warning, search for content normalization in the manual."
                 ,"");
      warn(local_268,(string *)&count);
      if (count.super_Pipeline._vptr_Pipeline != (_func_int **)psVar14) {
        operator_delete(count.super_Pipeline._vptr_Pipeline,
                        count.super_Pipeline.identifier._M_string_length + 1);
      }
    }
    if (new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_270 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270);
    }
    std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::~vector
              (&to_delete);
    local_27b = (bool)cVar8;
  }
  std::
  vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>::
  ~vector(&filters);
  return local_27b;
}

Assistant:

bool
Stream::pipeStreamData(
    Pipeline* pipeline,
    bool* filterp,
    int encode_flags,
    qpdf_stream_decode_level_e decode_level,
    bool suppress_warnings,
    bool will_retry)
{
    auto s = stream();
    std::vector<std::shared_ptr<QPDFStreamFilter>> filters;
    bool specialized_compression = false;
    bool lossy_compression = false;
    bool ignored;
    if (filterp == nullptr) {
        filterp = &ignored;
    }
    bool& filter = *filterp;
    filter = (!((encode_flags == 0) && (decode_level == qpdf_dl_none)));
    bool success = true;
    if (filter) {
        filter = filterable(filters, specialized_compression, lossy_compression);
        if ((decode_level < qpdf_dl_all) && lossy_compression) {
            filter = false;
        }
        if ((decode_level < qpdf_dl_specialized) && specialized_compression) {
            filter = false;
        }
        QTC::TC(
            "qpdf",
            "QPDF_Stream special filters",
            (!filter)                     ? 0
                : lossy_compression       ? 1
                : specialized_compression ? 2
                                          : 3);
    }

    if (pipeline == nullptr) {
        QTC::TC("qpdf", "QPDF_Stream pipeStreamData with null pipeline");
        // Return value is whether we can filter in this case.
        return filter;
    }

    // Construct the pipeline in reverse order. Force pipelines we create to be deleted when this
    // function finishes. Pipelines created by QPDFStreamFilter objects will be deleted by those
    // objects.
    std::vector<std::shared_ptr<Pipeline>> to_delete;

    std::shared_ptr<ContentNormalizer> normalizer;
    std::shared_ptr<Pipeline> new_pipeline;
    if (filter) {
        if (encode_flags & qpdf_ef_compress) {
            new_pipeline =
                std::make_shared<Pl_Flate>("compress stream", pipeline, Pl_Flate::a_deflate);
            to_delete.push_back(new_pipeline);
            pipeline = new_pipeline.get();
        }

        if (encode_flags & qpdf_ef_normalize) {
            normalizer = std::make_shared<ContentNormalizer>();
            new_pipeline =
                std::make_shared<Pl_QPDFTokenizer>("normalizer", normalizer.get(), pipeline);
            to_delete.push_back(new_pipeline);
            pipeline = new_pipeline.get();
        }

        for (auto iter = s->token_filters.rbegin(); iter != s->token_filters.rend(); ++iter) {
            new_pipeline =
                std::make_shared<Pl_QPDFTokenizer>("token filter", (*iter).get(), pipeline);
            to_delete.push_back(new_pipeline);
            pipeline = new_pipeline.get();
        }

        for (auto f_iter = filters.rbegin(); f_iter != filters.rend(); ++f_iter) {
            auto decode_pipeline = (*f_iter)->getDecodePipeline(pipeline);
            if (decode_pipeline) {
                pipeline = decode_pipeline;
            }
            auto* flate = dynamic_cast<Pl_Flate*>(pipeline);
            if (flate != nullptr) {
                flate->setWarnCallback([this](char const* msg, int code) { warn(msg); });
            }
        }
    }

    if (s->stream_data.get()) {
        QTC::TC("qpdf", "QPDF_Stream pipe replaced stream data");
        pipeline->write(s->stream_data->getBuffer(), s->stream_data->getSize());
        pipeline->finish();
    } else if (s->stream_provider.get()) {
        Pl_Count count("stream provider count", pipeline);
        if (s->stream_provider->supportsRetry()) {
            if (!s->stream_provider->provideStreamData(
                    obj->getObjGen(), &count, suppress_warnings, will_retry)) {
                filter = false;
                success = false;
            }
        } else {
            s->stream_provider->provideStreamData(obj->getObjGen(), &count);
        }
        qpdf_offset_t actual_length = count.getCount();
        qpdf_offset_t desired_length = 0;
        if (success && s->stream_dict.hasKey("/Length")) {
            desired_length = s->stream_dict.getKey("/Length").getIntValue();
            if (actual_length == desired_length) {
                QTC::TC("qpdf", "QPDF_Stream pipe use stream provider");
            } else {
                QTC::TC("qpdf", "QPDF_Stream provider length mismatch");
                // This would be caused by programmer error on the part of a library user, not by
                // invalid input data.
                throw std::runtime_error(
                    "stream data provider for " + obj->getObjGen().unparse(' ') + " provided " +
                    std::to_string(actual_length) + " bytes instead of expected " +
                    std::to_string(desired_length) + " bytes");
            }
        } else if (success) {
            QTC::TC("qpdf", "QPDF_Stream provider length not provided");
            s->stream_dict.replaceKey("/Length", QPDFObjectHandle::newInteger(actual_length));
        }
    } else if (obj->getParsedOffset() == 0) {
        QTC::TC("qpdf", "QPDF_Stream pipe no stream data");
        throw std::logic_error("pipeStreamData called for stream with no data");
    } else {
        QTC::TC("qpdf", "QPDF_Stream pipe original stream data");
        if (!QPDF::Pipe::pipeStreamData(
                obj->getQPDF(),
                obj->getObjGen(),
                obj->getParsedOffset(),
                s->length,
                s->stream_dict,
                isRootMetadata(),
                pipeline,
                suppress_warnings,
                will_retry)) {
            filter = false;
            success = false;
        }
    }

    if (filter && (!suppress_warnings) && normalizer.get() && normalizer->anyBadTokens()) {
        warn("content normalization encountered bad tokens");
        if (normalizer->lastTokenWasBad()) {
            QTC::TC("qpdf", "QPDF_Stream bad token at end during normalize");
            warn(
                "normalized content ended with a bad token; you may be able to resolve this by "
                "coalescing content streams in combination with normalizing content. From the "
                "command line, specify --coalesce-contents");
        }
        warn(
            "Resulting stream data may be corrupted but is may still useful for manual "
            "inspection. For more information on this warning, search for content normalization "
            "in the manual.");
    }

    return success;
}